

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int moveToRightmost(BtCursor *pCur)

{
  uint uVar1;
  MemPage *pMVar2;
  int rc;
  int iVar3;
  
  do {
    pMVar2 = pCur->apPage[pCur->iPage];
    if (pMVar2->leaf != '\0') {
      pCur->ix = pMVar2->nCell - 1;
      return 0;
    }
    uVar1 = *(uint *)(pMVar2->aData + (ulong)pMVar2->hdrOffset + 8);
    pCur->ix = pMVar2->nCell;
    iVar3 = moveToChild(pCur,uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                             uVar1 << 0x18);
  } while (iVar3 == 0);
  return iVar3;
}

Assistant:

static int moveToRightmost(BtCursor *pCur){
  Pgno pgno;
  int rc = SQLITE_OK;
  MemPage *pPage = 0;

  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->eState==CURSOR_VALID );
  while( !(pPage = pCur->apPage[pCur->iPage])->leaf ){
    pgno = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    pCur->ix = pPage->nCell;
    rc = moveToChild(pCur, pgno);
    if( rc ) return rc;
  }
  pCur->ix = pPage->nCell-1;
  assert( pCur->info.nSize==0 );
  assert( (pCur->curFlags & BTCF_ValidNKey)==0 );
  return SQLITE_OK;
}